

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

int addk(FuncState *fs,TValue *key,TValue *v)

{
  lua_State *L_00;
  Proto *o;
  int iVar1;
  int iVar2;
  TValue *pTVar3;
  Value *pVVar4;
  TValue *io2;
  TValue *io1;
  TValue *io;
  int oldsize;
  int k;
  TValue *idx;
  Proto *f;
  lua_State *L;
  TValue *v_local;
  TValue *key_local;
  FuncState *fs_local;
  
  L_00 = fs->ls->L;
  o = fs->f;
  pTVar3 = luaH_set(L_00,fs->ls->h,key);
  if (pTVar3->tt_ == 0x13) {
    if (pTVar3->tt_ != 0x13) {
      __assert_fail("((((idx))->tt_) == (((3) | ((1) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                    ,0x1be,"int addk(FuncState *, TValue *, TValue *)");
    }
    iVar1 = (pTVar3->value_).b;
    if (((iVar1 < fs->nk) && ((o->k[iVar1].tt_ & 0x7f) == (v->tt_ & 0x7f))) &&
       (iVar2 = luaV_equalobj((lua_State *)0x0,o->k + iVar1,v), iVar2 != 0)) {
      return iVar1;
    }
  }
  io._0_4_ = o->sizek;
  iVar1 = fs->nk;
  pTVar3->value_ = (Value)(long)iVar1;
  pTVar3->tt_ = 0x13;
  if (o->sizek < iVar1 + 1) {
    pTVar3 = (TValue *)luaM_growaux_(L_00,o->k,&o->sizek,0x10,0xffffff,"constants");
    o->k = pTVar3;
  }
  while ((int)io < o->sizek) {
    o->k[(int)io].tt_ = 0;
    io._0_4_ = (int)io + 1;
  }
  pVVar4 = &o->k[iVar1].value_;
  *pVVar4 = v->value_;
  *(LuaType *)(pVVar4 + 1) = v->tt_;
  if (((ulong)pVVar4[1] & 0x8000) != 0) {
    if (((ulong)pVVar4[1] & 0x8000) == 0) {
      __assert_fail("(((io1)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                    ,0x1cc,"int addk(FuncState *, TValue *, TValue *)");
    }
    if ((*(ushort *)(pVVar4 + 1) & 0x7f) != (ushort)pVVar4->gc->tt) {
LAB_00182be8:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                    ,0x1cc,"int addk(FuncState *, TValue *, TValue *)");
    }
    if (L_00 != (lua_State *)0x0) {
      if (((ulong)pVVar4[1] & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                      ,0x1cc,"int addk(FuncState *, TValue *, TValue *)");
      }
      if ((pVVar4->gc->marked & (L_00->l_G->currentwhite ^ 0x18)) != 0) goto LAB_00182be8;
    }
  }
  fs->nk = fs->nk + 1;
  if (((v->tt_ & 0x8000) != 0) && ((o->marked & 0x20) != 0)) {
    if ((v->tt_ & 0x8000) == 0) {
      __assert_fail("(((v)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                    ,0x1ce,"int addk(FuncState *, TValue *, TValue *)");
    }
    if ((((v->value_).gc)->marked & 0x18) != 0) {
      if (9 < (o->tt & 0xf)) {
        __assert_fail("(((f)->tt) & 0x0F) < (9+1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                      ,0x1ce,"int addk(FuncState *, TValue *, TValue *)");
      }
      if ((v->tt_ & 0x8000) == 0) {
        __assert_fail("(((v)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                      ,0x1ce,"int addk(FuncState *, TValue *, TValue *)");
      }
      luaC_barrier_(L_00,(GCObject *)o,(v->value_).gc);
    }
  }
  return iVar1;
}

Assistant:

static int addk (FuncState *fs, TValue *key, TValue *v) {
  lua_State *L = fs->ls->L;
  Proto *f = fs->f;
  TValue *idx = luaH_set(L, fs->ls->h, key);  /* index scanner table */
  int k, oldsize;
  if (ttisinteger(idx)) {  /* is there an index there? */
    k = cast_int(ivalue(idx));
    /* correct value? (warning: must distinguish floats from integers!) */
    if (k < fs->nk && ttype(&f->k[k]) == ttype(v) &&
                      luaV_rawequalobj(&f->k[k], v))
      return k;  /* reuse index */
  }
  /* constant not found; create a new entry */
  oldsize = f->sizek;
  k = fs->nk;
  /* numerical value does not need GC barrier;
     table has no metatable, so it does not need to invalidate cache */
  setivalue(idx, k);
  luaM_growvector(L, f->k, k, f->sizek, TValue, MAXARG_Ax, "constants");
  while (oldsize < f->sizek) setnilvalue(&f->k[oldsize++]);
  setobj(L, &f->k[k], v);
  fs->nk++;
  luaC_barrier(L, f, v);
  return k;
}